

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_execute(lua_State *L)

{
  int b;
  char *__command;
  int stat;
  char *cmd;
  lua_State *L_local;
  
  __command = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  b = system(__command);
  if (__command == (char *)0x0) {
    lua_pushboolean(L,b);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_execresult(L,b);
  }
  return L_local._4_4_;
}

Assistant:

static int os_execute(lua_State *L) {
    const char *cmd = luaL_optstring(L, 1, NULL);
    int stat = system(cmd);
    if (cmd != NULL)
        return luaL_execresult(L, stat);
    else {
        lua_pushboolean(L, stat);  /* true if there is a shell */
        return 1;
    }
}